

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O3

void __thiscall deqp::egl::GLES2ThreadTest::BufferData::exec(BufferData *this,Thread *t)

{
  ostream *poVar1;
  deUint32 dVar2;
  Thread *this_00;
  deUint8 *pdVar3;
  undefined1 local_1b8 [136];
  ios_base local_130 [264];
  
  this_00 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (this_00 != (Thread *)0x0) {
    pdVar3 = tcu::ThreadUtil::Thread::getDummyData(this_00,this->m_size);
    local_1b8._0_8_ = this_00;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    poVar1 = (ostream *)(local_1b8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Begin -- glBindBuffer(",0x16);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    (**(code **)(*(long *)&this_00[1].super_Thread.m_attribs + 0x40))
              (this->m_target,((this->m_buffer).m_ptr)->buffer);
    dVar2 = (**(code **)(*(long *)&this_00[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"bindBuffer(m_target, m_buffer->buffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x4ed);
    local_1b8._0_8_ = this_00;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x18),"End -- glBindBuffer()",0x15);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    local_1b8._0_8_ = this_00;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    poVar1 = (ostream *)(local_1b8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Begin -- glBufferData(",0x16);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
    std::ostream::_M_insert<long>((long)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", <DATA>, ",10);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    (**(code **)(*(long *)&this_00[1].super_Thread.m_attribs + 0x150))
              (this->m_target,this->m_size,pdVar3,this->m_usage);
    dVar2 = (**(code **)(*(long *)&this_00[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"bufferData(m_target, m_size, dummyData, m_usage)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x4f1);
    local_1b8._0_8_ = this_00;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x18),"End -- glBufferData()",0x15);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    local_1b8._0_8_ = this_00;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    poVar1 = (ostream *)(local_1b8 + 0x18);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Begin -- glBindBuffer(",0x16);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", 0)",4);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    (**(code **)(*(long *)&this_00[1].super_Thread.m_attribs + 0x40))(this->m_target,0);
    dVar2 = (**(code **)(*(long *)&this_00[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(dVar2,"bindBuffer(m_target, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x4f5);
    local_1b8._0_8_ = this_00;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b8 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b8 + 0x18),"End -- glBindBuffer()",0x15);
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b8 + 8));
    std::ios_base::~ios_base(local_130);
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void BufferData::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);
	void* dummyData = thread.getDummyData(m_size);

	thread.newMessage() << "Begin -- glBindBuffer(" << m_target << ", " << m_buffer->buffer << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindBuffer(m_target, m_buffer->buffer));
	thread.newMessage() << "End -- glBindBuffer()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glBufferData(" << m_target << ", " << m_size << ", <DATA>, " << m_usage << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bufferData(m_target, m_size, dummyData, m_usage));
	thread.newMessage() << "End -- glBufferData()" << tcu::ThreadUtil::Message::End;

	thread.newMessage() << "Begin -- glBindBuffer(" << m_target << ", 0)" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, bindBuffer(m_target, 0));
	thread.newMessage() << "End -- glBindBuffer()" << tcu::ThreadUtil::Message::End;
}